

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

int update_player(void)

{
  int iVar1;
  char *text;
  float fVar2;
  
  poll_input();
  iVar1 = -1;
  if (key[0x3b] == 0) {
    if (init_time != 0) {
      init_time = init_time + -1;
    }
    if ((die_time != 0) && (die_time = die_time + -1, die_time == 0)) {
      lives = lives + -1;
      if (lives == 0) {
        return 1;
      }
      init_time = 0x80;
      pos = 0.5;
      vel = 0.0;
      text = "One Life Remaining";
      if (lives == 1) {
        text = "This Is Your Final Life";
      }
      message(text);
    }
    if (die_time == 0) {
      if (key[0x52] != 0 || joy_left != 0) {
        vel = vel + -0.005;
      }
      if (key[0x53] != 0 || joy_right != 0) {
        vel = vel + 0.005;
      }
    }
    fVar2 = pos + vel;
    fVar2 = (float)(~-(uint)(fVar2 < 1.0) & (uint)(fVar2 + -1.0) |
                   (uint)fVar2 & -(uint)(fVar2 < 1.0));
    pos = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar2 | (uint)(fVar2 + 1.0) & -(uint)(fVar2 < 0.0));
    vel = vel * 0.67;
    if ((((die_time == 0) && (init_time == 0)) && (fire_time == 0)) &&
       (joy_b1 != 0 || key[0x4b] != 0)) {
      fire_bullet();
      fire_time = 0x18;
    }
    iVar1 = 0;
    if (fire_time != 0) {
      fire_time = fire_time + -1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int update_player()
{
   poll_input();

   /* quit game? */ 
   if (key[ALLEGRO_KEY_ESCAPE])
      return -1;

   /* safe period while initing */
   if (init_time)
      init_time--;

   /* blown up? */
   if (die_time) {
      die_time--;

      if (!die_time) {
	 lives--;
	 if (!lives)
	    return 1;

	 init_time = 128;
	 pos = 0.5;
	 vel = 0;

	 if (lives == 1)
	    message("This Is Your Final Life");
	 else
	    message("One Life Remaining");
      }
   }

   /* handle user left/right input */
   if (!die_time) {
      if ((joy_left) || (key[ALLEGRO_KEY_LEFT]))
	 vel -= 0.005;

      if ((joy_right) || (key[ALLEGRO_KEY_RIGHT]))
	 vel += 0.005;
   }

   /* move left and right */
   pos += vel;

   if (pos >= 1.0)
      pos -= 1.0;

   if (pos < 0.0)
      pos += 1.0;

   vel *= 0.67;

   /* fire bullets */
   if ((!die_time) && (!init_time) && (!fire_time)) {
      if ((key[ALLEGRO_KEY_SPACE]) || (joy_b1)) {
	 fire_bullet();
	 fire_time = 24;
      }
   }

   if (fire_time)
      fire_time--;

   return 0;
}